

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_circular_deque.h
# Opt level: O0

void __thiscall
quic::
QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>
::
AssignRange<quic::QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>::basic_iterator<quic::BandwidthSampler::AckPoint_const>,void>
          (QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>
           *this,basic_iterator<const_quic::BandwidthSampler::AckPoint> first,
          basic_iterator<const_quic::BandwidthSampler::AckPoint> last)

{
  basic_iterator<const_quic::BandwidthSampler::AckPoint> __last;
  basic_iterator<const_quic::BandwidthSampler::AckPoint> __first;
  bool bVar1;
  size_type new_cap;
  reference args;
  QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
  *this_local;
  basic_iterator<const_quic::BandwidthSampler::AckPoint> last_local;
  basic_iterator<const_quic::BandwidthSampler::AckPoint> first_local;
  
  last_local.deque_ =
       (QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
        *)last.index_;
  this_local = last.deque_;
  last_local.index_ = (size_type)first.deque_;
  QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
  ::ClearRetainCapacity
            ((QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
              *)this);
  __first.index_ = first.index_;
  __first.deque_ =
       (QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
        *)last_local.index_;
  __last.index_ = (size_type)last_local.deque_;
  __last.deque_ = this_local;
  new_cap = std::
            distance<quic::QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>::basic_iterator<quic::BandwidthSampler::AckPoint_const>>
                      (__first,__last);
  QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
  ::reserve((QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
             *)this,new_cap);
  while( true ) {
    bVar1 = operator!=((basic_iterator<const_quic::BandwidthSampler::AckPoint> *)&last_local.index_,
                       (basic_iterator<const_quic::BandwidthSampler::AckPoint> *)&this_local);
    if (!bVar1) break;
    args = QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
           ::basic_iterator<const_quic::BandwidthSampler::AckPoint>::operator*
                     ((basic_iterator<const_quic::BandwidthSampler::AckPoint> *)&last_local.index_);
    emplace_back<quic::BandwidthSampler::AckPoint_const&>(this,args);
    QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
    ::basic_iterator<const_quic::BandwidthSampler::AckPoint>::operator++
              ((basic_iterator<const_quic::BandwidthSampler::AckPoint> *)&last_local.index_);
  }
  return;
}

Assistant:

void AssignRange(InputIt first, InputIt last) {
    ClearRetainCapacity();
    if (std::is_base_of<
            std::random_access_iterator_tag,
            typename std::iterator_traits<InputIt>::iterator_category>::value) {
      reserve(std::distance(first, last));
    }
    for (; first != last; ++first) {
      emplace_back(*first);
    }
  }